

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O3

void test_bson_utf8_invalid(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  byte *pbVar4;
  int *piVar5;
  long *plVar6;
  char *pcVar7;
  uchar *puVar8;
  size_t sVar9;
  uint uVar10;
  char *unaff_RBX;
  char **ppcVar11;
  int iStack_34;
  short sStack_2e;
  char cStack_2c;
  code *pcStack_28;
  code *pcStack_20;
  code *pcStack_18;
  
  cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,1);
  if (cVar1 == '\0') {
    cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,0);
    if (cVar1 != '\0') goto LAB_001370f1;
    lVar3 = bson_utf8_escape_for_json(test_bson_utf8_invalid::bad,1);
    if (lVar3 == 0) {
      return;
    }
  }
  else {
    test_bson_utf8_invalid_cold_3();
LAB_001370f1:
    test_bson_utf8_invalid_cold_2();
  }
  test_bson_utf8_invalid_cold_1();
  pcStack_18 = (code *)0x137112;
  cVar1 = bson_utf8_validate("a",3,1);
  if (cVar1 == '\0') {
    pcStack_18 = (code *)0x1371ab;
    test_bson_utf8_nil_cold_1();
LAB_001371ab:
    pcStack_18 = (code *)0x1371b0;
    test_bson_utf8_nil_cold_4();
LAB_001371b0:
    pcStack_18 = (code *)0x1371b8;
    test_bson_utf8_nil_cold_2();
  }
  else {
    pcStack_18 = (code *)0x13712d;
    cVar1 = bson_utf8_validate("a",3,0);
    if (cVar1 != '\0') goto LAB_001371ab;
    pcStack_18 = (code *)0x137144;
    pbVar4 = (byte *)bson_utf8_escape_for_json("a",0xffffffffffffffff);
    if (pbVar4 != (byte *)0x14c71a) {
      uVar10 = *pbVar4 - 0x61;
      if (uVar10 == 0) {
        uVar10 = (uint)pbVar4[1];
      }
      if (uVar10 == 0) goto LAB_00137162;
      goto LAB_001371b0;
    }
LAB_00137162:
    pcStack_18 = (code *)0x13716a;
    bson_free(pbVar4);
    pcStack_18 = (code *)0x13717b;
    unaff_RBX = (char *)bson_utf8_escape_for_json("a",3);
    if (unaff_RBX == "a\\u0000b") {
LAB_0013719d:
      bson_free(unaff_RBX);
      return;
    }
    pcStack_18 = (code *)0x137199;
    iVar2 = strcmp("a\\u0000b",unaff_RBX);
    if (iVar2 == 0) goto LAB_0013719d;
  }
  pcStack_18 = test_bson_utf8_escape_for_json;
  test_bson_utf8_nil_cold_3();
  pcStack_20 = (code *)0x1371d2;
  pcStack_18 = (code *)unaff_RBX;
  piVar5 = (int *)bson_utf8_escape_for_json("my",6);
  if (*(int *)((long)piVar5 + 3) == 0x30303075 && *piVar5 == 0x755c796d) {
    unaff_RBX = (char *)0x79656b225c796d;
    pcStack_20 = (code *)0x1371fb;
    bson_free(piVar5);
    pcStack_20 = (code *)0x13720c;
    plVar6 = (long *)bson_utf8_escape_for_json("my\"key",6);
    if (*plVar6 != 0x79656b225c796d) goto LAB_001372a7;
    pcStack_20 = (code *)0x13721d;
    bson_free(plVar6);
    pcStack_20 = (code *)0x13722e;
    plVar6 = (long *)bson_utf8_escape_for_json("my\\key",6);
    unaff_RBX = (char *)0x79656b5c5c796d;
    if (*plVar6 != 0x79656b5c5c796d) goto LAB_001372ac;
    pcStack_20 = (code *)0x137242;
    bson_free(plVar6);
    pcStack_20 = (code *)0x137255;
    plVar6 = (long *)bson_utf8_escape_for_json("\\\"\\\"",0xffffffffffffffff);
    if ((char)plVar6[1] != '\0' || *plVar6 != 0x225c5c5c225c5c5c) goto LAB_001372b1;
    pcStack_20 = (code *)0x137273;
    bson_free(plVar6);
    pcStack_20 = (code *)0x137286;
    piVar5 = (int *)bson_utf8_escape_for_json("\x0e",0xffffffffffffffff);
    if (*(int *)((long)piVar5 + 3) == 0x653030 && *piVar5 == 0x3030755c) {
      bson_free(piVar5);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x1372a7;
    test_bson_utf8_escape_for_json_cold_1();
LAB_001372a7:
    pcStack_20 = (code *)0x1372ac;
    test_bson_utf8_escape_for_json_cold_2();
LAB_001372ac:
    pcStack_20 = (code *)0x1372b1;
    test_bson_utf8_escape_for_json_cold_3();
LAB_001372b1:
    pcStack_20 = (code *)0x1372b6;
    test_bson_utf8_escape_for_json_cold_4();
  }
  pcStack_20 = test_bson_utf8_get_char;
  test_bson_utf8_escape_for_json_cold_5();
  pcStack_28 = (code *)0x1372c8;
  pcStack_20 = (code *)unaff_RBX;
  iVar2 = bson_utf8_get_char("asdf");
  if (iVar2 == 0x61) {
    pcStack_28 = (code *)0x1372dd;
    unaff_RBX = (char *)bson_utf8_next_char("asdf");
    pcStack_28 = (code *)0x1372e8;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x73) goto LAB_001373e6;
    pcStack_28 = (code *)0x1372f9;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x137304;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 100) goto LAB_001373eb;
    pcStack_28 = (code *)0x137315;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x137320;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x66) goto LAB_001373f0;
    pcStack_28 = (code *)0x137331;
    pcVar7 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar7 != '\0') goto LAB_001373f5;
    pcStack_28 = (code *)0x137346;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
    if (iVar2 != 0x20ac) goto LAB_001373fa;
    pcStack_28 = (code *)0x13735d;
    puVar8 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
    if (puVar8 != test_bson_utf8_get_char::test2 + 3) goto LAB_001373ff;
    pcStack_28 = (code *)0x137379;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
    if (iVar2 != 0x20) goto LAB_00137404;
    pcStack_28 = (code *)0x13738e;
    unaff_RBX = (char *)bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
    pcStack_28 = (code *)0x137399;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137409;
    pcStack_28 = (code *)0x1373a8;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x1373b3;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20) goto LAB_0013740e;
    pcStack_28 = (code *)0x1373c0;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x1373cb;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00137413;
    pcStack_28 = (code *)0x1373da;
    pcVar7 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar7 == '\0') {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x1373e6;
    test_bson_utf8_get_char_cold_1();
LAB_001373e6:
    pcStack_28 = (code *)0x1373eb;
    test_bson_utf8_get_char_cold_2();
LAB_001373eb:
    pcStack_28 = (code *)0x1373f0;
    test_bson_utf8_get_char_cold_3();
LAB_001373f0:
    pcStack_28 = (code *)0x1373f5;
    test_bson_utf8_get_char_cold_4();
LAB_001373f5:
    pcStack_28 = (code *)0x1373fa;
    test_bson_utf8_get_char_cold_5();
LAB_001373fa:
    pcStack_28 = (code *)0x1373ff;
    test_bson_utf8_get_char_cold_6();
LAB_001373ff:
    pcStack_28 = (code *)0x137404;
    test_bson_utf8_get_char_cold_7();
LAB_00137404:
    pcStack_28 = (code *)0x137409;
    test_bson_utf8_get_char_cold_8();
LAB_00137409:
    pcStack_28 = (code *)0x13740e;
    test_bson_utf8_get_char_cold_9();
LAB_0013740e:
    pcStack_28 = (code *)0x137413;
    test_bson_utf8_get_char_cold_10();
LAB_00137413:
    pcStack_28 = (code *)0x137418;
    test_bson_utf8_get_char_cold_11();
  }
  pcStack_28 = test_bson_utf8_from_unichar;
  test_bson_utf8_get_char_cold_12();
  pcStack_28 = (code *)unaff_RBX;
  bson_utf8_from_unichar(0,&sStack_2e,&iStack_34);
  if (iStack_34 == 1) {
    bson_utf8_from_unichar(0x80,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_001376dc;
    bson_utf8_from_unichar(0x800,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_001376e1;
    bson_utf8_from_unichar(0x10000,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_001376e6;
    bson_utf8_from_unichar(0x200000,&sStack_2e,&iStack_34);
    if (iStack_34 != 5) goto LAB_001376eb;
    bson_utf8_from_unichar(0x4000000,&sStack_2e,&iStack_34);
    if (iStack_34 != 6) goto LAB_001376f0;
    bson_utf8_from_unichar(0x7f,&sStack_2e,&iStack_34);
    if (iStack_34 != 1) goto LAB_001376f5;
    bson_utf8_from_unichar(0x7ff,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_001376fa;
    bson_utf8_from_unichar(0xffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_001376ff;
    bson_utf8_from_unichar(0x1fffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00137704;
    bson_utf8_from_unichar(0x3ffffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 5) goto LAB_00137709;
    bson_utf8_from_unichar(0x7fffffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 6) goto LAB_0013770e;
    bson_utf8_from_unichar(0xd7ff,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_00137713;
    bson_utf8_from_unichar(0xe000,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_00137718;
    bson_utf8_from_unichar(0xfffd,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_0013771d;
    bson_utf8_from_unichar(0x10ffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00137722;
    bson_utf8_from_unichar(0x110000,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00137727;
    bson_utf8_from_unichar(0x61,&sStack_2e,&iStack_34);
    if (iStack_34 != 1) goto LAB_0013772c;
    if ((char)sStack_2e != 'a') goto LAB_00137731;
    bson_utf8_from_unichar(0xff,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_00137736;
    if (sStack_2e != -0x403d) goto LAB_0013773b;
    bson_utf8_from_unichar(0x20ac,&sStack_2e,&iStack_34);
    if (iStack_34 == 3) {
      if (cStack_2c == -0x54 && sStack_2e == -0x7d1e) {
        return;
      }
      goto LAB_00137745;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_001376dc:
    test_bson_utf8_from_unichar_cold_2();
LAB_001376e1:
    test_bson_utf8_from_unichar_cold_3();
LAB_001376e6:
    test_bson_utf8_from_unichar_cold_4();
LAB_001376eb:
    test_bson_utf8_from_unichar_cold_5();
LAB_001376f0:
    test_bson_utf8_from_unichar_cold_6();
LAB_001376f5:
    test_bson_utf8_from_unichar_cold_7();
LAB_001376fa:
    test_bson_utf8_from_unichar_cold_8();
LAB_001376ff:
    test_bson_utf8_from_unichar_cold_9();
LAB_00137704:
    test_bson_utf8_from_unichar_cold_10();
LAB_00137709:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013770e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00137713:
    test_bson_utf8_from_unichar_cold_13();
LAB_00137718:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013771d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00137722:
    test_bson_utf8_from_unichar_cold_16();
LAB_00137727:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013772c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00137731:
    test_bson_utf8_from_unichar_cold_19();
LAB_00137736:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013773b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00137745:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar11 = test_bson_utf8_non_shortest::tests;
  puVar8 = (uchar *)0x0;
  do {
    pcVar7 = *ppcVar11;
    sVar9 = strlen(pcVar7);
    cVar1 = bson_utf8_validate(pcVar7,sVar9,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001377a9;
    }
    puVar8 = (uchar *)((long)&((TestSuite *)puVar8)->prgname + 1);
    ppcVar11 = ppcVar11 + 1;
  } while ((TestSuite *)puVar8 != (TestSuite *)0x5);
  puVar8 = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001377a9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)puVar8,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)puVar8,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_invalid (void)
{
   /* no UTF-8 sequence can start with 0x80 */
   static const unsigned char bad[] = {0x80, 0};

   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, false));
   BSON_ASSERT (!bson_utf8_escape_for_json ((const char *) bad, 1));
}